

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int start,int num,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int i;
  ulong uVar2;
  
  if (num < 1) {
    return;
  }
  if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
    if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
      uVar2 = 0;
      do {
        elements[uVar2] =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->super_RepeatedPtrFieldBase).rep_)->elements[(long)start + uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)num != uVar2);
    }
    else {
      uVar2 = 0;
      do {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x20);
        (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
        pbVar1->_M_string_length = 0;
        (pbVar1->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)pbVar1);
        elements[uVar2] = pbVar1;
        uVar2 = uVar2 + 1;
      } while ((uint)num != uVar2);
    }
  }
  internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  typename internal::TypeImplementsMergeBehavior<
      typename TypeHandler::Type>::type t;
  ExtractSubrangeInternal(start, num, elements, t);
}